

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_limit.cpp
# Opt level: O3

void __thiscall
duckdb::LogicalLimit::LogicalLimit
          (LogicalLimit *this,BoundLimitNode *limit_val,BoundLimitNode *offset_val)

{
  idx_t iVar1;
  undefined7 uVar2;
  
  LogicalOperator::LogicalOperator(&this->super_LogicalOperator,LOGICAL_LIMIT);
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)&PTR__LogicalLimit_01983848;
  uVar2 = *(undefined7 *)&limit_val->field_0x1;
  iVar1 = limit_val->constant_integer;
  (this->limit_val).type = limit_val->type;
  *(undefined7 *)&(this->limit_val).field_0x1 = uVar2;
  (this->limit_val).constant_integer = iVar1;
  (this->limit_val).constant_percentage = limit_val->constant_percentage;
  (this->limit_val).expression.
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (limit_val->expression).
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (limit_val->expression).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  (this->offset_val).constant_percentage = offset_val->constant_percentage;
  uVar2 = *(undefined7 *)&offset_val->field_0x1;
  iVar1 = offset_val->constant_integer;
  (this->offset_val).type = offset_val->type;
  *(undefined7 *)&(this->offset_val).field_0x1 = uVar2;
  (this->offset_val).constant_integer = iVar1;
  (this->offset_val).expression.
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (offset_val->expression).
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (offset_val->expression).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  return;
}

Assistant:

LogicalLimit::LogicalLimit(BoundLimitNode limit_val, BoundLimitNode offset_val)
    : LogicalOperator(LogicalOperatorType::LOGICAL_LIMIT), limit_val(std::move(limit_val)),
      offset_val(std::move(offset_val)) {
}